

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

SerializationCompatibility * duckdb::SerializationCompatibility::Latest(void)

{
  SerializationCompatibility *in_RDI;
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"latest",&local_31);
  FromString(in_RDI,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  in_RDI->manually_set = false;
  return in_RDI;
}

Assistant:

SerializationCompatibility SerializationCompatibility::Latest() {
	auto res = FromString("latest");
	res.manually_set = false;
	return res;
}